

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::BasicBinding::CheckIndexed
          (BasicBinding *this,GLenum e,GLuint index,GLuint expected)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  CallLogWrapper *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  GLboolean b;
  GLint i;
  GLfloat f;
  GLint64 i64;
  GLdouble d;
  GLboolean local_49;
  GLuint local_48;
  float local_44;
  GLuint local_40 [2];
  double local_38;
  
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegeri_v(this_00,e,index,(GLint *)&local_48);
  glu::CallLogWrapper::glGetInteger64i_v(this_00,e,index,(GLint64 *)local_40);
  glu::CallLogWrapper::glGetFloati_v(this_00,e,index,&local_44);
  glu::CallLogWrapper::glGetDoublei_v(this_00,e,index,&local_38);
  uVar3 = (ulong)e;
  glu::CallLogWrapper::glGetBooleani_v(this_00,e,index,&local_49);
  bVar4 = local_48 == expected;
  bVar5 = (GLuint)(long)local_44 == expected;
  bVar6 = (GLuint)(long)local_38 == expected;
  bVar7 = (bool)local_49 == (expected != 0);
  bVar2 = bVar7 && bVar6;
  if (((!bVar5 || local_40[0] != expected) || (!bVar7 || !bVar6)) || !bVar4) {
    pcVar1 = ShaderStorageBufferObjectBase::GLenumToString
                       ((ShaderStorageBufferObjectBase *)(ulong)e,
                        (GLenum)CONCAT71((int7)(uVar3 >> 8),bVar2));
    anon_unknown_0::Output
              ("%s at index %d is %d should be %d.\n",pcVar1,(ulong)index,(ulong)local_48,
               (ulong)expected);
  }
  return ((bVar5 && local_40[0] == expected) && bVar2) && bVar4;
}

Assistant:

bool CheckIndexed(GLenum e, GLuint index, GLuint expected)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		glGetIntegeri_v(e, index, &i);
		glGetInteger64i_v(e, index, &i64);
		glGetFloati_v(e, index, &f);
		glGetDoublei_v(e, index, &d);
		glGetBooleani_v(e, index, &b);

		bool status = true;
		if (static_cast<GLuint>(i) != expected)
			status = false;
		if (static_cast<GLuint>(i64) != expected)
			status = false;
		if (static_cast<GLuint>(f) != expected)
			status = false;
		if (static_cast<GLuint>(d) != expected)
			status = false;
		if (b != (expected != 0 ? GL_TRUE : GL_FALSE))
			status = false;

		if (!status)
		{
			Output("%s at index %d is %d should be %d.\n", GLenumToString(e), index, i, expected);
		}
		return status;
	}